

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printVectorListThree(MCInst *MI,uint OpNum,SStream *O)

{
  byte bVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint uVar4;
  uint8_t *puVar5;
  MCOperand *pMVar6;
  char *pcVar7;
  uint8_t uVar8;
  
  pcVar2 = MI->csh;
  uVar4 = MCInst_getOpcode(MI);
  bVar1 = MI->ac_idx;
  puVar5 = ARM_get_op_access(pcVar2,uVar4);
  uVar8 = '\0';
  if (puVar5[bVar1] != 0x80) {
    uVar8 = puVar5[bVar1];
  }
  SStream_concat0(O,"{");
  pcVar2 = MI->csh;
  pMVar6 = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getReg(pMVar6);
  pcVar7 = (*pcVar2->get_regname)(uVar4);
  SStream_concat0(O,pcVar7);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar5 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x41;
    puVar5[0] = '\x01';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    pMVar6 = MCInst_getOperand(MI,OpNum);
    uVar4 = MCOperand_getReg(pMVar6);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x45) = uVar4;
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups[(ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x5e] = uVar8;
    puVar5 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar5 = *puVar5 + '\x01';
  }
  SStream_concat0(O,", ");
  pcVar2 = MI->csh;
  pMVar6 = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getReg(pMVar6);
  pcVar7 = (*pcVar2->get_regname)(uVar4 + 1);
  SStream_concat0(O,pcVar7);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar5 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x41;
    puVar5[0] = '\x01';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    pMVar6 = MCInst_getOperand(MI,OpNum);
    uVar4 = MCOperand_getReg(pMVar6);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x45) =
         uVar4 + 1;
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups[(ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x5e] = uVar8;
    puVar5 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar5 = *puVar5 + '\x01';
  }
  SStream_concat0(O,", ");
  pcVar2 = MI->csh;
  pMVar6 = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getReg(pMVar6);
  pcVar7 = (*pcVar2->get_regname)(uVar4 + 2);
  SStream_concat0(O,pcVar7);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar5 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x41;
    puVar5[0] = '\x01';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    pMVar6 = MCInst_getOperand(MI,OpNum);
    uVar4 = MCOperand_getReg(pMVar6);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x45) =
         uVar4 + 2;
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups[(ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x5e] = uVar8;
    puVar5 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar5 = *puVar5 + '\x01';
  }
  SStream_concat0(O,"}");
  MI->ac_idx = MI->ac_idx + '\x01';
  return;
}

Assistant:

static void printVectorListThree(MCInst *MI, unsigned OpNum, SStream *O)
{
#ifndef CAPSTONE_DIET
	uint8_t access;

	access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
#endif

	// Normally, it's not safe to use register enum values directly with
	// addition to get the next register, but for VFP registers, the
	// sort order is guaranteed because they're all of the form D<n>.
	SStream_concat0(O, "{");
	printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, OpNum)));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
#ifndef CAPSTONE_DIET
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, ", ");
	printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, OpNum)) + 1);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum)) + 1;
#ifndef CAPSTONE_DIET
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, ", ");
	printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, OpNum)) + 2);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum)) + 2;
#ifndef CAPSTONE_DIET
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, "}");

#ifndef CAPSTONE_DIET
	MI->ac_idx++;
#endif
}